

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O3

void * TPZStructMatrixOR<std::complex<double>_>::ThreadData::ThreadWork(void *datavoid)

{
  TPZCompMesh *mesh;
  TPZCompEl *pTVar1;
  bool bVar2;
  int iVar3;
  int64_t nelem;
  TPZElementMatrixT<std::complex<double>_> *pTVar4;
  TPZCompEl **ppTVar5;
  long lVar6;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> ek;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> ef;
  TPZAutoPointer<TPZGuiInterface> guiInterface;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> local_58;
  TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_> local_50;
  TPZAutoPointer<TPZGuiInterface> local_48;
  TPZChunkVector<TPZCompEl_*,_10> *local_40;
  long local_38;
  
  nelem = NextElement((ThreadData *)datavoid);
  mesh = *(TPZCompMesh **)(*datavoid + 8);
  local_48.fRef = *(TPZReference **)((long)datavoid + 8);
  LOCK();
  ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i =
       ((local_48.fRef)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_38 = (mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>.fNElements;
  local_40 = &(mesh->fElementVec).super_TPZChunkVector<TPZCompEl_*,_10>;
  do {
    if (local_38 <= nelem) break;
    local_58.fRef = (TPZReference *)operator_new(0x10);
    ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
    (local_58.fRef)->fPointer = (TPZElementMatrixT<std::complex<double>_> *)0x0;
    LOCK();
    ((local_58.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
    UNLOCK();
    pTVar4 = (TPZElementMatrixT<std::complex<double>_> *)operator_new(0x81d0);
    TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(pTVar4,mesh,EF);
    local_50.fRef = (TPZReference *)operator_new(0x10);
    ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i = 0;
    (local_50.fRef)->fPointer = pTVar4;
    LOCK();
    ((local_50.fRef)->fCounter).super___atomic_base<int>._M_i = 1;
    UNLOCK();
    if (*(long *)((long)datavoid + 0x10) == 0) {
      TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=(&local_58,&local_50);
    }
    else {
      pTVar4 = (TPZElementMatrixT<std::complex<double>_> *)operator_new(0x81d0);
      TPZElementMatrixT<std::complex<double>_>::TPZElementMatrixT(pTVar4,mesh,EK);
      TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::operator=(&local_58,pTVar4);
    }
    ppTVar5 = TPZChunkVector<TPZCompEl_*,_10>::operator[](local_40,nelem);
    pTVar1 = *ppTVar5;
    if (*(long *)((long)datavoid + 0x10) == 0) {
      (**(code **)(*(long *)pTVar1 + 0x128))(pTVar1,(local_50.fRef)->fPointer);
    }
    else {
      (**(code **)(*(long *)pTVar1 + 0x110))
                (pTVar1,(local_58.fRef)->fPointer,(local_50.fRef)->fPointer);
    }
    if (((local_48.fRef == (TPZReference *)0x0) ||
        ((local_48.fRef)->fPointer == (TPZGuiInterface *)0x0)) ||
       (bVar2 = TPZGuiInterface::AmIKilled((local_48.fRef)->fPointer), !bVar2)) {
      iVar3 = (**(code **)(*(long *)pTVar1 + 0x1f0))(pTVar1);
      if (iVar3 == 0) {
        TPZElementMatrix::ComputeDestinationIndices
                  (&(local_58.fRef)->fPointer->super_TPZElementMatrix);
        lVar6 = *datavoid;
        if (*(char *)(lVar6 + 0x58) != '\0') goto LAB_0133e4d9;
      }
      else {
        if (*(long *)((long)datavoid + 0x10) != 0) {
          (*((local_58.fRef)->fPointer->super_TPZElementMatrix)._vptr_TPZElementMatrix[6])();
        }
        (*((local_50.fRef)->fPointer->super_TPZElementMatrix)._vptr_TPZElementMatrix[6])();
        TPZElementMatrix::ComputeDestinationIndices
                  (&(local_58.fRef)->fPointer->super_TPZElementMatrix);
        lVar6 = *datavoid;
        if (*(char *)(lVar6 + 0x58) == '\x01') {
LAB_0133e4d9:
          TPZEquationFilter::Filter
                    ((TPZEquationFilter *)(lVar6 + 0x48),
                     &((local_58.fRef)->fPointer->super_TPZElementMatrix).fSourceIndex.
                      super_TPZVec<long>,
                     &((local_58.fRef)->fPointer->super_TPZElementMatrix).fDestinationIndex.
                      super_TPZVec<long>);
        }
      }
      ComputedElementMatrix((ThreadData *)datavoid,nelem,&local_58,&local_50);
      nelem = NextElement((ThreadData *)datavoid);
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer(&local_50);
    TPZAutoPointer<TPZElementMatrixT<std::complex<double>_>_>::~TPZAutoPointer(&local_58);
  } while (bVar2);
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)((long)datavoid + 0x88));
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  TPZSemaphore::Post((TPZSemaphore *)((long)datavoid + 0xb0));
  pthread_mutex_unlock((pthread_mutex_t *)((long)datavoid + 0x88));
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer(&local_48);
  return (void *)0x0;
}

Assistant:

void *
TPZStructMatrixOR<TVar>::ThreadData::ThreadWork(void *datavoid) {
#ifdef PZDEBUG
    TExceptionManager activateExceptions;
#endif
    ThreadData *data = (ThreadData *) datavoid;
    const bool computeRhs = data->fComputeRhs;
    // compute the next element (this method is threadsafe)
    int64_t iel = data->NextElement();

    TPZCompMesh *cmesh = data->fStruct->Mesh();
    TPZAutoPointer<TPZGuiInterface> guiInterface = data->fGuiInterface;
    int64_t nel = cmesh->NElements();
    while (iel < nel) {

        TPZAutoPointer<TPZElementMatrixT<TVar>> ek;
        TPZAutoPointer<TPZElementMatrixT<TVar>> ef =
            new TPZElementMatrixT<TVar>(cmesh, TPZElementMatrix::EF);
        if (data->fGlobMatrix) {
            ek = new TPZElementMatrixT<TVar>(cmesh, TPZElementMatrix::EK);
        } else {
            ek = ef;
        }

        TPZCompEl *el = cmesh->ElementVec()[iel];

#ifndef DRY_RUN
        if (data->fGlobMatrix) {
            el->CalcStiff(ek, ef);
        } else {
            el->CalcResidual(ef);
        }
#else
        {
            TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *> (el);
            if (!intel) {
                DebugStop();
            }
            if (data->fGlobMatrix) {
                intel->InitializeElementMatrix(ekr, efr);
            } else {
                intel->InitializeElementMatrix(efr);
            }
        }
#endif

        if (guiInterface) if (guiInterface->AmIKilled()) {
                break;
            }

        if (!el->HasDependency()) {
            ek->ComputeDestinationIndices();

            if (data->fStruct->HasRange()) {
                data->fStruct->FilterEquations(ek->fSourceIndex, ek->fDestinationIndex);
            }
#ifdef PZ_LOG
            if (loggerel.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Element index " << iel << std::endl;
                ek->fMat.Print("Element stiffness matrix", sout);
                if(computeRhs) ef->fMat.Print("Element right hand side", sout);
                LOGPZ_DEBUG(loggerel, sout.str())
            }
#endif
        } else {
            // the element has dependent nodes
            if (data->fGlobMatrix) {
                ek->ApplyConstraints();
            }
            ef->ApplyConstraints();
            ek->ComputeDestinationIndices();
            if (data->fStruct->HasRange()) {
                data->fStruct->FilterEquations(ek->fSourceIndex, ek->fDestinationIndex);
            }
#ifdef PZ_LOG
            if (loggerel2.isDebugEnabled() && el->Reference() && el->Reference()->MaterialId() == 1 && el->IsInterface()) {
                std::stringstream sout;
                el->Reference()->Print(sout);
                el->Print(sout);
                ek->Print(sout);
                //			ef->Print(sout);
                LOGPZ_DEBUG(loggerel2, sout.str())
            }
#endif
#ifdef PZ_LOG
            if (loggerel.isDebugEnabled()) {
                std::stringstream sout;
                sout << "Element index " << iel << std::endl;
                ek->fConstrMat.Print("Element stiffness matrix", sout);
                if(computeRhs) ef->fConstrMat.Print("Element right hand side", sout);
                LOGPZ_DEBUG(loggerel, sout.str())
            }
#endif
        }


        // put the elementmatrices on the stack to be assembled (threadsafe)
        data->ComputedElementMatrix(iel, ek, ef);
        // compute the next element (this method is threadsafe)
        iel = data->NextElement();
    }

    {
      std::scoped_lock lock(data->fMutexAccessElement);
      data->fAssembly.Post();
    }

    return 0;
}